

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParsePciEBifurcationBlock(PciEBifurcationBlock_t *dblock)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  PciELane_t *pPStack_20;
  int count2;
  PciELane_t *laneDescr;
  int idx2;
  int idx1;
  PciEBifurcationBlock_t *dblock_local;
  
  pPStack_20 = dblock->LaneDescriptors;
  printf("   COM-HPC PCI-E Bifurcation block:\n");
  for (laneDescr._4_4_ = 0; laneDescr._4_4_ < (int)(uint)dblock->NrOfLaneDescriptors;
      laneDescr._4_4_ = laneDescr._4_4_ + 1) {
    bVar1 = pPStack_20->NrOfConfigurations;
    pcVar2 = "";
    if ((pPStack_20->LaneCapabilities & 0x20) != 0) {
      pcVar2 = "; NVME";
    }
    pcVar3 = "";
    if ((pPStack_20->LaneCapabilities & 0x40) != 0) {
      pcVar3 = "; PEG";
    }
    pcVar4 = "";
    if ((pPStack_20->LaneCapabilities & 0x80) != 0) {
      pcVar4 = "; Target";
    }
    printf("      Lane %d: Gen%d%s%s%s\n",(ulong)pPStack_20->LaneNumber,
           (ulong)(pPStack_20->LaneCapabilities & 0xf),pcVar2,pcVar3,pcVar4);
    printf("         Configurations: ");
    for (laneDescr._0_4_ = 0; (int)laneDescr < (int)(uint)bVar1;
        laneDescr._0_4_ = (int)laneDescr + 1) {
      pcVar2 = "";
      if ((pPStack_20->Configurations[(int)laneDescr] & 0x80) != 0) {
        pcVar2 = "(R)";
      }
      printf("%d%s ",(ulong)(pPStack_20->Configurations[(int)laneDescr] & 0x3f),pcVar2);
    }
    printf("\n");
    pPStack_20 = (PciELane_t *)(pPStack_20->Configurations + (int)(uint)bVar1);
  }
  return;
}

Assistant:

void ParsePciEBifurcationBlock(PciEBifurcationBlock_t *dblock)
{
    int idx1, idx2;
    PciELane_t *laneDescr = dblock->LaneDescriptors;
	printf("   COM-HPC PCI-E Bifurcation block:\n");
    for(idx1 = 0; idx1 < dblock->NrOfLaneDescriptors; idx1++) {
        int count2 = laneDescr->NrOfConfigurations;
        printf("      Lane %d: Gen%d%s%s%s\n", 
            laneDescr->LaneNumber, 
            laneDescr->LaneCapabilities & 0xF,
            laneDescr->LaneCapabilities & 0x20 ? "; NVME" : "",
            laneDescr->LaneCapabilities & 0x40 ? "; PEG" : "",
            laneDescr->LaneCapabilities & 0x80 ? "; Target" : "");
        printf("         Configurations: ");
        for(idx2 = 0; idx2 < count2; idx2++) {
            printf("%d%s ", 
                laneDescr->Configurations[idx2] & 0x3F,
                laneDescr->Configurations[idx2] & 0x80 ? "(R)" : ""); 
        }
        printf("\n");
        laneDescr = (PciELane_t *)((const char *)laneDescr + FIELD_OFFSET(PciELane_t, Configurations) + count2);
    }
}